

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Recorder::getMessage(Recorder *this,size_t index)

{
  bool bVar1;
  Message *in_RDX;
  unsigned_long in_RSI;
  Message *in_RDI;
  nullptr_t in_stack_ffffffffffffffc8;
  _Head_base<0UL,_helics::Message_*,_false> _Var2;
  
  _Var2._M_head_impl = in_RDI;
  bVar1 = isValidIndex<unsigned_long,std::vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>>
                    (in_RSI,(vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                             *)in_RDI);
  if (bVar1) {
    CLI::std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)(in_RSI + 400),(size_type)in_RDX);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator*
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI);
    std::make_unique<helics::Message,helics::Message&>(in_RDX);
  }
  else {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
               in_stack_ffffffffffffffc8);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Message> Recorder::getMessage(std::size_t index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}